

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_42f343::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody
          (RSATest_DISABLED_BlindingCacheConcurrency_Test *this)

{
  bool bVar1;
  RSA *__p;
  char *message;
  char *in_R9;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  size_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  type worker;
  uint8_t kDummyHash [32];
  size_t kNumThreads;
  size_t kSignaturesPerThread;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<RSA> rsa;
  RSATest_DISABLED_BlindingCacheConcurrency_Test *this_local;
  
  __p = RSA_private_key_from_bytes((anonymous_namespace)::kKey1,0x260);
  std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
  testing::AssertionResult::AssertionResult<std::unique_ptr<rsa_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8b4dc8,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x5c9,message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    worker.kDummyHash = (uint8_t (*) [32])0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&gtest_ar_.message_;
    worker.rsa = (UniquePtr<RSA> *)&worker.kDummyHash;
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&i);
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve
              ((vector<std::thread,_std::allocator<std::thread>_> *)&i,0x800);
    for (__range1 = (vector<std::thread,_std::allocator<std::thread>_> *)0x0;
        __range1 < (vector<std::thread,_std::allocator<std::thread>_> *)0x800;
        __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)
                   ((long)&(__range1->super__Vector_base<std::thread,_std::allocator<std::thread>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 1)) {
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<(anonymous_namespace)::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody()::__0&>
                ((vector<std::thread,std::allocator<std::thread>> *)&i,
                 (type *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)&i);
    thread = (thread *)
             std::vector<std::thread,_std::allocator<std::thread>_>::end
                       ((vector<std::thread,_std::allocator<std::thread>_> *)&i);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                       *)&thread), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*(&__end1);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&__end1);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&i);
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(RSATest, DISABLED_BlindingCacheConcurrency) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey1, sizeof(kKey1)));
  ASSERT_TRUE(rsa);

#if defined(OPENSSL_TSAN)
  constexpr size_t kSignaturesPerThread = 10;
  constexpr size_t kNumThreads = 10;
#else
  constexpr size_t kSignaturesPerThread = 100;
  constexpr size_t kNumThreads = 2048;
#endif

  const uint8_t kDummyHash[32] = {0};
  auto worker = [&] {
    std::vector<uint8_t> sig(RSA_size(rsa.get()));
    for (size_t i = 0; i < kSignaturesPerThread; i++) {
      unsigned sig_len = sig.size();
      EXPECT_TRUE(RSA_sign(NID_sha256, kDummyHash, sizeof(kDummyHash),
                           sig.data(), &sig_len, rsa.get()));
    }
  };

  std::vector<std::thread> threads;
  threads.reserve(kNumThreads);
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back(worker);
  }
  for (auto &thread : threads) {
    thread.join();
  }
}